

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O2

ze_result_t driver::zetDeviceEnableMetricsExp(zet_device_handle_t hDevice)

{
  ze_result_t zVar1;
  
  if (DAT_0010d7d8 != (code *)0x0) {
    zVar1 = (*DAT_0010d7d8)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDeviceEnableMetricsExp(
        zet_device_handle_t hDevice                     ///< [in] handle of the device where metrics collection has to be enabled.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnEnableMetricsExp = context.zetDdiTable.DeviceExp.pfnEnableMetricsExp;
        if( nullptr != pfnEnableMetricsExp )
        {
            result = pfnEnableMetricsExp( hDevice );
        }
        else
        {
            // generic implementation
        }

        return result;
    }